

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::DebugDocument>
               (AllocatorType *allocator,DebugDocument *obj)

{
  size_t sVar1;
  long *plVar2;
  long extraout_RDX;
  code *local_40;
  FreeFuncType freeFunc;
  DebugDocument *obj_local;
  AllocatorType *allocator_local;
  
  Js::DebugDocument::~DebugDocument(obj);
  local_40 = (code *)TypeAllocatorFunc<Memory::HeapAllocator,_Js::DebugDocument>::GetFreeFunc();
  plVar2 = (long *)((long)&allocator->m_privateHeap + extraout_RDX);
  if (((ulong)local_40 & 1) != 0) {
    local_40 = *(code **)(local_40 + *plVar2 + -1);
  }
  sVar1 = _AllocatorDelete<Js::DebugDocument,_(Memory::AllocatorDeleteFlags)0>::Size();
  (*local_40)(plVar2,obj,sVar1);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj)
{
    obj->~T();

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size());
}